

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  int iVar1;
  sqlite3 *psVar2;
  uint uVar3;
  char *pcVar4;
  
  iVar1 = pMem->szMalloc;
  if (n <= iVar1) goto LAB_0012c6e4;
  uVar3 = 0x20;
  if (0x20 < n) {
    uVar3 = n;
  }
  if (iVar1 < 1 || bPreserve == 0) {
    if (0 < iVar1) {
      pcVar4 = pMem->zMalloc;
      goto LAB_0012c684;
    }
LAB_0012c690:
    if (pMem->db == (sqlite3 *)0x0) {
      pcVar4 = (char *)sqlite3Malloc((ulong)uVar3);
    }
    else {
      pcVar4 = (char *)sqlite3DbMallocRawNN(pMem->db,(ulong)uVar3);
    }
    pMem->zMalloc = pcVar4;
  }
  else {
    pcVar4 = pMem->zMalloc;
    if (pMem->z != pcVar4) {
LAB_0012c684:
      sqlite3DbFree(pMem->db,pcVar4);
      goto LAB_0012c690;
    }
    pcVar4 = (char *)sqlite3DbReallocOrFree(pMem->db,pMem->z,(ulong)uVar3);
    pMem->zMalloc = pcVar4;
    pMem->z = pcVar4;
    bPreserve = 0;
  }
  if (pcVar4 == (char *)0x0) {
    if ((pMem->flags & 0x2460) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    return 7;
  }
  psVar2 = pMem->db;
  if (((psVar2 == (sqlite3 *)0x0) || (pcVar4 < (psVar2->lookaside).pStart)) ||
     ((psVar2->lookaside).pEnd <= pcVar4)) {
    uVar3 = (*sqlite3Config.m.xSize)(pcVar4);
  }
  else {
    uVar3 = (uint)(psVar2->lookaside).sz;
  }
  pMem->szMalloc = uVar3;
LAB_0012c6e4:
  if (((bPreserve != 0) && (pcVar4 = pMem->z, pcVar4 != (char *)0x0)) && (pcVar4 != pMem->zMalloc))
  {
    memcpy(pMem->zMalloc,pcVar4,(long)pMem->n);
  }
  uVar3._0_2_ = pMem->flags;
  uVar3._2_1_ = pMem->enc;
  uVar3._3_1_ = pMem->eSubtype;
  if ((uVar3 >> 10 & 1) != 0) {
    (*pMem->xDel)(pMem->z);
    uVar3._0_2_ = pMem->flags;
  }
  pMem->z = pMem->zMalloc;
  pMem->flags = (ushort)uVar3 & 0xe3ff;
  return 0;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( (pMem->flags&MEM_RowSet)==0 );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db, pMem->zMalloc) );
  if( pMem->szMalloc<n ){
    if( n<32 ) n = 32;
    if( bPreserve && pMem->szMalloc>0 && pMem->z==pMem->zMalloc ){
      pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
      bPreserve = 0;
    }else{
      if( pMem->szMalloc>0 ) sqlite3DbFree(pMem->db, pMem->zMalloc);
      pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
    }
    if( pMem->zMalloc==0 ){
      sqlite3VdbeMemSetNull(pMem);
      pMem->z = 0;
      pMem->szMalloc = 0;
      return SQLITE_NOMEM_BKPT;
    }else{
      pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
    }
  }

  if( bPreserve && pMem->z && pMem->z!=pMem->zMalloc ){
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}